

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::set_htt_hmixTYP(PeleLM *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  MultiFab *src;
  pointer pIVar7;
  Long LVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  double *__s;
  ulong uVar12;
  long lVar13;
  Real RVar14;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray baf;
  MFIter mfi;
  MultiFab hmix;
  int local_388;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_378;
  ulong local_360;
  pointer local_358;
  PeleLM *local_350;
  ulong local_348;
  ulong local_340;
  BoxArray *local_338;
  __uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> local_330;
  ulong local_328;
  long local_320;
  double *local_318;
  long local_310;
  long local_308;
  long local_300;
  double *local_2f8;
  long local_2f0;
  ulong local_2e8;
  undefined1 local_2e0 [104];
  MFIter local_278;
  Array4<double> local_218;
  Box local_1d4;
  Print local_1b8;
  
  htt_hmixTYP = typical_values.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[RhoH];
  if ((htt_hmixTYP != -10000000000.0) || (NAN(htt_hmixTYP))) {
    if (1 < NavierStokesBase::verbose) {
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"     setting htt_hmixTYP(from user input) = ",0x2c);
      std::ostream::_M_insert<double>(htt_hmixTYP);
      local_2e0[0] = true;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_2e0,1);
      amrex::Print::~Print(&local_1b8);
    }
  }
  else {
    uVar9 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                      super_AmrMesh.super_AmrInfo.field_0x8c;
    local_360 = (ulong)uVar9;
    uVar12 = 0;
    htt_hmixTYP = 0.0;
    local_378.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (-1 < (int)uVar9) {
      local_340 = (ulong)(uVar9 + 1);
      local_350 = this;
      do {
        local_330._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t;
        src = *(MultiFab **)
               (*(long *)((long)local_330._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x170) + 200);
        local_338 = (BoxArray *)
                    ((long)local_330._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8);
        local_2e0._0_8_ = 1;
        local_2e0._24_8_ = (pointer)0x0;
        local_2e0._32_8_ = (pointer)0x0;
        local_2e0._8_8_ = (Arena *)0x0;
        local_2e0._16_8_ = (pointer)0x0;
        amrex::MultiFab::MultiFab
                  ((MultiFab *)&local_1b8,local_338,
                   (DistributionMapping *)
                   ((long)local_330._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,0
                   ,(MFInfo *)local_2e0,
                   (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2e0 + 0x10));
        amrex::MultiFab::Copy((MultiFab *)&local_1b8,src,RhoH,0,1,0);
        amrex::MultiFab::Divide((MultiFab *)&local_1b8,src,3,0,1,0);
        if (uVar12 != local_360) {
          amrex::BoxArray::BoxArray
                    ((BoxArray *)local_2e0,
                     (BoxArray *)
                     ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12 + 1]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                     + 0xd8));
          pIVar7 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                   super_AmrMesh.super_AmrInfo.ref_ratio.
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_278.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                 *)pIVar7[uVar12].vect;
          local_278.fabArray._0_4_ = pIVar7[uVar12].vect[2];
          amrex::BoxArray::coarsen((BoxArray *)local_2e0,(IntVect *)&local_278);
          local_348 = uVar12;
          amrex::MFIter::MFIter(&local_278,(FabArrayBase *)&local_1b8,true);
          if (local_278.currentIndex < local_278.endIndex) {
            do {
              amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_218,(FabArray<amrex::FArrayBox> *)&local_1b8,&local_278);
              amrex::BATransformer::operator()
                        (&local_1d4,&local_338->m_bat,
                         (Box *)((long)((local_278.index_map)->
                                       super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[local_278.currentIndex] *
                                 0x1c + *(long *)(((BoxArray *)
                                                  ((long)local_330._M_t.
                                                                                                                  
                                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                                  _M_head_impl + 0xd8))->m_ref).
                                                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr));
              amrex::BoxArray::intersections((BoxArray *)local_2e0,&local_1d4,&local_378);
              LVar8 = local_218.jstride;
              local_358 = local_378.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              if ((long)local_378.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_378.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0) {
                local_310 = (long)local_378.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_378.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5;
                local_300 = local_218.kstride;
                local_320 = (long)local_218.begin.y;
                lVar13 = local_218.jstride * 8;
                local_310 = local_310 + (ulong)(local_310 == 0);
                local_318 = local_218.p + -(long)local_218.begin.x;
                local_328 = (ulong)(uint)-local_218.begin.z;
                lVar10 = 0;
                do {
                  uVar9 = local_358[lVar10].second.smallend.vect[2];
                  iVar2 = local_358[lVar10].second.bigend.vect[2];
                  local_308 = lVar10;
                  if ((int)uVar9 <= iVar2) {
                    iVar3 = local_358[lVar10].second.bigend.vect[0];
                    iVar4 = local_358[lVar10].second.bigend.vect[1];
                    iVar5 = local_358[lVar10].second.smallend.vect[1];
                    local_2f0 = (long)iVar5;
                    iVar6 = local_358[lVar10].second.smallend.vect[0];
                    local_2f8 = (double *)((local_2f0 - local_320) * lVar13 + (long)local_318);
                    local_388 = (int)local_328 + uVar9;
                    do {
                      local_2e8 = (ulong)uVar9;
                      if ((int)local_2f0 <= iVar4) {
                        __s = local_2f8 + local_388 * local_300 + (long)iVar6;
                        iVar11 = (iVar4 - iVar5) + 1;
                        do {
                          if (iVar6 <= iVar3) {
                            memset(__s,0,(ulong)(uint)(iVar3 - iVar6) * 8 + 8);
                          }
                          __s = __s + LVar8;
                          iVar11 = iVar11 + -1;
                        } while (iVar11 != 0);
                      }
                      uVar9 = (int)local_2e8 + 1;
                      local_388 = local_388 + 1;
                    } while ((int)local_2e8 != iVar2);
                  }
                  lVar10 = local_308 + 1;
                } while (lVar10 != local_310);
              }
              amrex::MFIter::operator++(&local_278);
            } while (local_278.currentIndex < local_278.endIndex);
          }
          amrex::MFIter::~MFIter(&local_278);
          amrex::BoxArray::~BoxArray((BoxArray *)local_2e0);
          uVar12 = local_348;
          this = local_350;
        }
        RVar14 = amrex::MultiFab::norm0((MultiFab *)&local_1b8,0,0,false,false);
        if (RVar14 <= htt_hmixTYP) {
          RVar14 = htt_hmixTYP;
        }
        htt_hmixTYP = RVar14;
        amrex::MultiFab::~MultiFab((MultiFab *)&local_1b8);
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_340);
    }
    if (1 < NavierStokesBase::verbose) {
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"     setting htt_hmixTYP(via domain scan) = ",0x2c);
      std::ostream::_M_insert<double>(htt_hmixTYP);
      local_2e0[0] = true;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_2e0,1);
      amrex::Print::~Print(&local_1b8);
    }
    if (local_378.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_378.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_378.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
PeleLM::set_htt_hmixTYP ()
{
   const int finest_level = parent->finestLevel();

   // set typical value for hmix, needed for TfromHY solves if not provided explicitly
   if (typical_values[RhoH]==typical_RhoH_value_default)
   {
      htt_hmixTYP = 0;
      std::vector< std::pair<int,Box> > isects;
      for (int lvl = 0; lvl <= finest_level; lvl++)
      {
         AmrLevel&       ht = getLevel(lvl);
         const MultiFab& S  = ht.get_new_data(State_Type);
         const BoxArray& ba = ht.boxArray();
         const DistributionMapping& dm = ht.DistributionMap();
         MultiFab hmix(ba,dm,1,0,MFInfo(),Factory());
         MultiFab::Copy(hmix,S,RhoH,0,1,0);
         MultiFab::Divide(hmix,S,Density,0,1,0);
         if (lvl != finest_level)
         {
            AmrLevel& htf = getLevel(lvl+1);
            BoxArray  baf = htf.boxArray();
            baf.coarsen(parent->refRatio(lvl));
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(hmix,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               auto const& h_mix = hmix.array(mfi);
               baf.intersections(ba[mfi.index()],isects);
               for (long unsigned int is = 0; is < isects.size(); is++) {
                  amrex::ParallelFor(isects[is].second, [h_mix]
                  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                  {
                     h_mix(i,j,k) = 0.0;
                  });
               }
            }
         }
         htt_hmixTYP = std::max(htt_hmixTYP,hmix.norm0(0));
      }
      ParallelDescriptor::ReduceRealMax(htt_hmixTYP);
      if (verbose > 1)
      amrex::Print() << "     setting htt_hmixTYP(via domain scan) = " << htt_hmixTYP << '\n';
   }
   else
   {
      htt_hmixTYP = typical_values[RhoH];
      if (verbose > 1)
         amrex::Print() << "     setting htt_hmixTYP(from user input) = " << htt_hmixTYP << '\n';
   }
}